

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

bool __thiscall
xatlas::internal::segment::Atlas::computeChartBasis(Atlas *this,Chart *chart,Basis *basis)

{
  uint32_t uVar1;
  uint uVar2;
  Mesh *this_00;
  float fVar3;
  bool bVar4;
  uint32_t index;
  uint *puVar5;
  Vector3 *pVVar6;
  Vector3 *pVVar7;
  int iVar8;
  uint32_t j;
  int iVar9;
  uint32_t index_00;
  
  uVar1 = (chart->faces).m_base.size;
  Array<xatlas::internal::Vector3>::resize(&this->m_tempPoints,uVar1 * 3);
  iVar8 = 0;
  for (index_00 = 0; index_00 != uVar1; index_00 = index_00 + 1) {
    puVar5 = Array<unsigned_int>::operator[](&chart->faces,index_00);
    uVar2 = *puVar5;
    for (iVar9 = 0; iVar9 != 3; iVar9 = iVar9 + 1) {
      this_00 = this->m_mesh;
      index = Mesh::vertexAt(this_00,uVar2 * 3 + iVar9);
      pVVar6 = Array<xatlas::internal::Vector3>::operator[](&this_00->m_positions,index);
      pVVar7 = Array<xatlas::internal::Vector3>::operator[](&this->m_tempPoints,iVar8 + iVar9);
      fVar3 = pVVar6->y;
      pVVar7->x = pVVar6->x;
      pVVar7->y = fVar3;
      pVVar7->z = pVVar6->z;
    }
    iVar8 = iVar8 + 3;
  }
  bVar4 = Fit::computeBasis((Vector3 *)(this->m_tempPoints).m_base.buffer,
                            (this->m_tempPoints).m_base.size,basis);
  return bVar4;
}

Assistant:

bool computeChartBasis(Chart *chart, Basis *basis)
	{
		const uint32_t faceCount = chart->faces.size();
		m_tempPoints.resize(chart->faces.size() * 3);
		for (uint32_t i = 0; i < faceCount; i++) {
			const uint32_t f = chart->faces[i];
			for (uint32_t j = 0; j < 3; j++)
				m_tempPoints[i * 3 + j] = m_mesh->position(m_mesh->vertexAt(f * 3 + j));
		}
		return Fit::computeBasis(m_tempPoints.data(), m_tempPoints.size(), basis);
	}